

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ParseComment(Lexer *this)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  
  AdvanceCurrent(this);
  bVar1 = IsNextCharacter(this,'-');
  if (bVar1) {
    do {
      AdvanceCurrent(this);
      pcVar3 = this->m_end;
      pcVar4 = this->m_current;
      cVar2 = *pcVar4;
      if (cVar2 != '-') break;
    } while (pcVar4 <= pcVar3);
    while( true ) {
      if ((cVar2 == '\0') || (pcVar3 < pcVar4)) {
        Error<>(this,"Mismatched block comments");
        return;
      }
      uVar5 = 0;
      while ((cVar2 == '-' && (pcVar4 <= pcVar3))) {
        uVar5 = uVar5 + 1;
        AdvanceCurrent(this);
        pcVar4 = this->m_current;
        cVar2 = *pcVar4;
        pcVar3 = this->m_end;
      }
      if (2 < uVar5) break;
      if ((cVar2 == '\r') || (cVar2 == '\n')) {
        ParseEndOfLine(this);
      }
      else {
        AdvanceCurrent(this);
      }
      pcVar3 = this->m_end;
      pcVar4 = this->m_current;
      cVar2 = *pcVar4;
    }
  }
  else {
    while( true ) {
      cVar2 = *this->m_current;
      if ((cVar2 == '\0') || (this->m_end < this->m_current)) break;
      if ((cVar2 == '\r') || (cVar2 == '\n')) {
        ParseEndOfLine(this);
        return;
      }
      AdvanceCurrent(this);
    }
  }
  return;
}

Assistant:

inline_t void Lexer::ParseComment()
	{
		AdvanceCurrent();
		bool blockComment = IsNextCharacter('-');

		// This is a block comment
		if (blockComment)
		{
			AdvanceCurrent();

			// Advance until the end of the line or until we stop seeing dashes
			while (!IsEndOfText())
			{
				if (*m_current != '-')
					break;
				AdvanceCurrent();
			}

			// Find minimum run of three dashes to closed block comment
			while (!IsEndOfText())
			{
				uint32_t dashCount = 0;
				while (!IsEndOfText() && *m_current == '-')
				{
					dashCount++;
					AdvanceCurrent();
				}
				if (dashCount >= 3)
					return;
				else if (IsNewline(*m_current))
					ParseEndOfLine();
				else
					AdvanceCurrent();
			}
			Error("Mismatched block comments");
		}
		// This is a single line comment
		else
		{
			// Advance until the end of the line, then return
			while (!IsEndOfText())
			{
				if (IsNewline(*m_current))
				{
					ParseEndOfLine();
					return;
				}
				AdvanceCurrent();
			}
		}
	}